

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O0

void __thiscall
soplex::ClassArray<soplex::Nonzero<double>_>::reSize
          (ClassArray<soplex::Nonzero<double>_> *this,int newsize)

{
  int in_ESI;
  long in_RDI;
  ClassArray<soplex::Nonzero<double>_> *in_stack_00000018;
  
  if (*(int *)(in_RDI + 0xc) < in_ESI) {
    reMax(in_stack_00000018,this._4_4_,(int)this);
  }
  else if (in_ESI < 0) {
    *(undefined4 *)(in_RDI + 8) = 0;
  }
  else {
    *(int *)(in_RDI + 8) = in_ESI;
  }
  return;
}

Assistant:

void reSize(int newsize)
   {
      assert(memFactor >= 1);

      if(newsize > themax)
         reMax(int(memFactor * newsize), newsize);
      else if(newsize < 0)
         thesize = 0;
      else
         thesize = newsize;
   }